

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolRules(NinjaMain *this,Options *options,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rule *this_00;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar4;
  EvalString *this_01;
  _Base_ptr p_Var5;
  bool bVar6;
  _Rb_tree_header *p_Var7;
  string local_50;
  
  _optind = 1;
  bVar2 = false;
  do {
    bVar6 = bVar2;
    iVar3 = getopt(argc + 1,argv + -1,"hd");
    bVar2 = true;
  } while (iVar3 == 100);
  if (iVar3 == -1) {
    pmVar4 = BindingEnv::GetRules_abi_cxx11_(&(this->state_).bindings_);
    p_Var5 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var7) {
      paVar1 = &local_50.field_2;
      do {
        printf("%s",*(undefined8 *)(p_Var5 + 1));
        if (bVar6) {
          this_00 = *(Rule **)(p_Var5 + 2);
          local_50._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"description","");
          this_01 = Rule::GetBinding(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (this_01 != (EvalString *)0x0) {
            EvalString::Unparse_abi_cxx11_(&local_50,this_01);
            printf(": %s",local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
        putchar(10);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var7);
    }
    iVar3 = 0;
  }
  else {
    puts(
        "usage: ninja -t rules [options]\n\noptions:\n  -d     also print the description of the rule\n  -h     print this message"
        );
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int NinjaMain::ToolRules(const Options* options, int argc, char* argv[]) {
  // Parse options.

  // The rules tool uses getopt, and expects argv[0] to contain the name of
  // the tool, i.e. "rules".
  argc++;
  argv--;

  bool print_description = false;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("hd"))) != -1) {
    switch (opt) {
    case 'd':
      print_description = true;
      break;
    case 'h':
    default:
      printf("usage: ninja -t rules [options]\n"
             "\n"
             "options:\n"
             "  -d     also print the description of the rule\n"
             "  -h     print this message\n"
             );
    return 1;
    }
  }
  argv += optind;
  argc -= optind;

  // Print rules

  typedef map<string, const Rule*> Rules;
  const Rules& rules = state_.bindings_.GetRules();
  for (Rules::const_iterator i = rules.begin(); i != rules.end(); ++i) {
    printf("%s", i->first.c_str());
    if (print_description) {
      const Rule* rule = i->second;
      const EvalString* description = rule->GetBinding("description");
      if (description != NULL) {
        printf(": %s", description->Unparse().c_str());
      }
    }
    printf("\n");
  }
  return 0;
}